

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::SetWindowCollapsed(char *name,bool collapsed,ImGuiCond cond)

{
  ImGuiID key;
  void *pvVar1;
  
  key = ImHashStr(name,0,0);
  pvVar1 = ImGuiStorage::GetVoidPtr(&GImGui->WindowsById,key);
  if ((pvVar1 != (void *)0x0) &&
     ((cond == 0 || (((char)(*(uint *)((long)pvVar1 + 0xbc) >> 0x10) & cond) != 0)))) {
    *(uint *)((long)pvVar1 + 0xbc) = *(uint *)((long)pvVar1 + 0xbc) & 0xfff1ffff;
    *(bool *)((long)pvVar1 + 0x99) = collapsed;
  }
  return;
}

Assistant:

void ImGui::SetWindowCollapsed(const char* name, bool collapsed, ImGuiCond cond)
{
    if (ImGuiWindow* window = FindWindowByName(name))
        SetWindowCollapsed(window, collapsed, cond);
}